

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (zParam != (char *)0x0 && zFilename != (char *)0x0) {
    sVar2 = strlen(zFilename);
    for (pcVar3 = zFilename + ((uint)sVar2 & 0x3fffffff); pcVar3 = pcVar3 + 1, *pcVar3 != '\0';
        pcVar3 = pcVar3 + ((uint)sVar2 & 0x3fffffff)) {
      iVar1 = strcmp(pcVar3,zParam);
      sVar2 = strlen(pcVar3);
      pcVar3 = pcVar3 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
      if (iVar1 == 0) {
        return pcVar3;
      }
      sVar2 = strlen(pcVar3);
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( zFilename[0] ){
    int x = strcmp(zFilename, zParam);
    zFilename += sqlite3Strlen30(zFilename) + 1;
    if( x==0 ) return zFilename;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return 0;
}